

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O3

bool __thiscall trun::Process_Unix::Duplicate(Process_Unix *this)

{
  int iVar1;
  ILogger *pIVar2;
  char *pcVar3;
  string local_38;
  
  iVar1 = posix_spawn_file_actions_adddup2
                    ((posix_spawn_file_actions_t *)&this->child_fd_actions,this->pipe_stdout[1],1);
  if (iVar1 == 0) {
    iVar1 = posix_spawn_file_actions_adddup2
                      ((posix_spawn_file_actions_t *)&this->child_fd_actions,this->pipe_stderr[1],2)
    ;
    if (iVar1 == 0) {
      return true;
    }
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Process_Unix","");
    pIVar2 = gnilk::Logger::GetLogger(&local_38);
    pcVar3 = strerror(iVar1);
    gnilk::Log::Error<char_const*,int,char*>
              (pIVar2,"posix_spawn_file_actions_adddup2 %d, %s",iVar1,pcVar3);
  }
  else {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Process_Unix","");
    pIVar2 = gnilk::Logger::GetLogger(&local_38);
    pcVar3 = strerror(iVar1);
    gnilk::Log::Error<char_const*,int,char*>
              (pIVar2,"posix_spawn_file_actions_adddup2 %d, %s",iVar1,pcVar3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool Process_Unix::Duplicate() {
	int status;
	// stdout
	status = posix_spawn_file_actions_adddup2(&child_fd_actions, pipe_stdout[1], 1);
	if (status) {
        gnilk::Logger::GetLogger("Process_Unix")->Error("posix_spawn_file_actions_adddup2 %d, %s", status, strerror(status));
		return false;
	}
	// stderr
	status = posix_spawn_file_actions_adddup2(&child_fd_actions, pipe_stderr[1], 2);
	if (status) {
        gnilk::Logger::GetLogger("Process_Unix")->Error("posix_spawn_file_actions_adddup2 %d, %s", status, strerror(status));
		return false;					
	}
	return true;
}